

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectList.cpp
# Opt level: O0

bool __thiscall
ObjectList::Intersect(ObjectList *this,Ray *ray,float t_min,float t_max,hit_record_t *hit_record)

{
  long *plVar1;
  void *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  int i;
  float t_closest;
  bool hit;
  hit_record_t temp_hit;
  undefined6 in_stack_ffffffffffffff80;
  byte in_stack_ffffffffffffff87;
  hit_record_t *in_stack_ffffffffffffff90;
  int local_5c;
  undefined4 local_58;
  byte local_51;
  undefined4 local_50 [12];
  void *local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_20 = in_RDX;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  hit_record_t::hit_record_t(in_stack_ffffffffffffff90);
  local_51 = 0;
  local_58 = local_18;
  for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x10); local_5c = local_5c + 1) {
    plVar1 = *(long **)(*(long *)(in_RDI + 8) + (long)local_5c * 8);
    in_stack_ffffffffffffff87 =
         (**(code **)(*plVar1 + 0x10))(local_14,local_58,plVar1,local_10,local_50);
    if ((in_stack_ffffffffffffff87 & 1) != 0) {
      local_51 = 1;
      local_58 = local_50[0];
      memcpy(local_20,local_50,0x30);
    }
  }
  hit_record_t::~hit_record_t
            ((hit_record_t *)
             CONCAT17(in_stack_ffffffffffffff87,CONCAT16(local_51,in_stack_ffffffffffffff80)));
  return (bool)(local_51 & 1);
}

Assistant:

bool
ObjectList::Intersect(const Ray& ray, float t_min, float t_max, hit_record_t& hit_record) const {

    hit_record_t temp_hit;
    bool         hit       = false;
    float        t_closest = t_max;

    for (int i = 0; i < m_size; i++) {
        if (m_list[i]->Intersect(ray, t_min, t_closest, temp_hit)) {
            hit        = true;
            t_closest  = temp_hit.m_t;
            hit_record = temp_hit;
        }
    }
    return hit;
}